

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O2

void __thiscall lzham::lzcompressor::state::reset(state *this)

{
  uint i;
  long lVar1;
  bool bVar2;
  
  (this->super_state_base).m_cur_ofs = 0;
  (this->super_state_base).m_cur_state = 0;
  this->m_block_start_dict_ofs = 0;
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_match_model[lVar1].m_bit_0_prob = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_rep_model[lVar1].m_bit_0_prob = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_rep0_model[lVar1].m_bit_0_prob = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_rep0_single_byte_model[lVar1].m_bit_0_prob = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_rep1_model[lVar1].m_bit_0_prob = 0x400;
  }
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 1) {
    this->m_is_rep2_model[lVar1].m_bit_0_prob = 0x400;
  }
  lVar1 = 2;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    lzham::quasi_adaptive_huffman_data_model::reset();
    lzham::quasi_adaptive_huffman_data_model::reset();
  }
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  (this->super_state_base).m_match_hist[0] = 1;
  (this->super_state_base).m_match_hist[1] = 1;
  (this->super_state_base).m_match_hist[2] = 1;
  (this->super_state_base).m_match_hist[3] = 1;
  return;
}

Assistant:

void lzcompressor::state::reset()
   {
      m_cur_ofs = 0;
      m_cur_state = 0;
      m_block_start_dict_ofs = 0;

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++) 
         m_is_match_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep_model); i++) 
         m_is_rep_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_model); i++) 
         m_is_rep0_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_single_byte_model); i++) 
         m_is_rep0_single_byte_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep1_model); i++) 
         m_is_rep1_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep2_model); i++) 
         m_is_rep2_model[i].clear();
      
      for (uint i = 0; i < 2; i++)
      {
         m_rep_len_table[i].reset();
         m_large_len_table[i].reset();
      }
      m_main_table.reset();
      m_dist_lsb_table.reset();

      m_lit_table.reset();
      m_delta_lit_table.reset();
      
      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
   }